

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

void __thiscall TypeOpCall::TypeOpCall(TypeOpCall *this,TypeFactory *t)

{
  OpBehavior *this_00;
  allocator local_39;
  string local_38 [32];
  TypeFactory *local_18;
  TypeFactory *t_local;
  TypeOpCall *this_local;
  
  local_18 = t;
  t_local = (TypeFactory *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"call",&local_39);
  TypeOp::TypeOp(&this->super_TypeOp,t,CPUI_CALL,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (this->super_TypeOp)._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_0084aed8;
  (this->super_TypeOp).opflags = 0x20814;
  this_00 = (OpBehavior *)operator_new(0x10);
  OpBehavior::OpBehavior(this_00,CPUI_CALL,false,true);
  (this->super_TypeOp).behave = this_00;
  return;
}

Assistant:

TypeOpCall::TypeOpCall(TypeFactory *t) : TypeOp(t,CPUI_CALL,"call")

{
  opflags = (PcodeOp::special|PcodeOp::call|PcodeOp::coderef|PcodeOp::nocollapse);
  behave = new OpBehavior(CPUI_CALL,false,true); // Dummy behavior
}